

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O0

void rmlLinkedListDestroy(void *self)

{
  int64_t iVar1;
  rmlLinkedList *m;
  void *self_local;
  
  while( true ) {
    iVar1 = rmlLinkedListGetLength(self);
    if (iVar1 == 0) break;
    rmlLinkedListPop(self);
  }
  rmlLinkedListReset((rmlLinkedList *)self);
  free(self);
  return;
}

Assistant:

void rmlLinkedListDestroy(void *self) {
    struct rmlLinkedList *m = self;

    while (rmlLinkedListGetLength(self)) {
        rmlLinkedListPop(self);
    }

    rmlLinkedListReset(self);
    RML_VERBOSE("Destroy LinkedList(0x%llx)", (uint64_t) m)
    free(m);
}